

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O2

void __thiscall
cmFindLibraryHelper::RegexFromLiteral(cmFindLibraryHelper *this,string *out,string *in)

{
  byte *pbVar1;
  byte *pbVar2;
  
  pbVar1 = (byte *)(in->_M_dataplus)._M_p;
  for (pbVar2 = pbVar1; pbVar2 != pbVar1 + in->_M_string_length; pbVar2 = pbVar2 + 1) {
    if ((*pbVar2 - 0x24 < 0x3b) &&
       ((0x7800000080006f1U >> ((ulong)(*pbVar2 - 0x24) & 0x3f) & 1) != 0)) {
      std::__cxx11::string::append((char *)out);
    }
    std::__cxx11::string::push_back((char)out);
    pbVar1 = (byte *)(in->_M_dataplus)._M_p;
  }
  return;
}

Assistant:

void cmFindLibraryHelper::RegexFromLiteral(std::string& out,
                                           std::string const& in)
{
  for(std::string::const_iterator ci = in.begin(); ci != in.end(); ++ci)
    {
    char ch = *ci;
    if(ch == '[' || ch == ']' || ch == '(' || ch == ')' || ch == '\\' ||
       ch == '.' || ch == '*' || ch == '+' || ch == '?' || ch == '-' ||
       ch == '^' || ch == '$')
      {
      out += "\\";
      }
#if defined(_WIN32) || defined(__APPLE__)
    out += tolower(ch);
#else
    out += ch;
#endif
    }
}